

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashutil.h
# Opt level: O2

string * getCommonCodeGen<std::__cxx11::string>
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *keys,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *vals,vector<int,_std::allocator<int>_> *mapping,size_t n,string *map_name,
                   bool nonKeyLookups)

{
  pointer pbVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  char *__rhs;
  int *piVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  char cVar8;
  string *val;
  pointer pbVar9;
  ulong uVar10;
  size_type sVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  size_t local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  vector<int,_std::allocator<int>_> *local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> start;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sze;
  size_t num_chars;
  string upper_name;
  string local_70;
  string local_50;
  
  local_128 = n;
  local_100 = mapping;
  std::__cxx11::string::string((string *)&upper_name,(string *)map_name);
  for (sVar11 = 0; upper_name._M_string_length != sVar11; sVar11 = sVar11 + 1) {
    iVar4 = toupper((int)upper_name._M_dataplus._M_p[sVar11]);
    upper_name._M_dataplus._M_p[sVar11] = (char)iVar4;
  }
  std::operator+(&local_120,"//CODEGEN FILE\n#ifndef POIFECT_",&upper_name);
  std::operator+(&local_148,&local_120,"_H\n#define POIFECT_");
  std::operator+(&local_168,&local_148,&upper_name);
  std::operator+(__return_storage_ptr__,&local_168,"_H\n#include <array>\n");
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_120);
  if (!nonKeyLookups) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&num_chars,
                 "class ",map_name);
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&num_chars;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&start,pbVar7,
                 " final{\npublic:\n    static ");
  typeStr(&local_50,pbVar7);
  bVar3 = std::operator!=(&local_50,"std::string");
  __rhs = "";
  if (bVar3) {
    __rhs = "constexpr ";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sze,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&start,__rhs);
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sze;
  std::operator+(&local_120,pbVar7,"std::string_view lookup(const ");
  typeStr(&local_70,pbVar7);
  std::operator+(&local_148,&local_120,&local_70);
  std::operator+(&local_168,&local_148,"& key) noexcept;\n\nprivate:\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&sze);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&start);
  std::__cxx11::string::~string((string *)&num_chars);
  if (!nonKeyLookups) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  writeKeys(__return_storage_ptr__,keys,local_100,local_128);
  if (!nonKeyLookups) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  num_chars = 0;
  sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar1 = (vals->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar9 = (vals->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar1; pbVar9 = pbVar9 + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&start,&num_chars);
    local_168._M_dataplus._M_p = (pointer)pbVar9->_M_string_length;
    num_chars = (size_t)(local_168._M_dataplus._M_p + num_chars);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&sze,(unsigned_long *)&local_168);
  }
  std::__cxx11::to_string(&local_120,num_chars + 1);
  std::operator+(&local_148,"    static constexpr char flat_vals[",&local_120);
  std::operator+(&local_168,&local_148,"] = ");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_120);
  pbVar1 = (vals->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar9 = (vals->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar1; pbVar9 = pbVar9 + 1) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    cVar8 = '\b';
    while (bVar3 = cVar8 != '\0', cVar8 = cVar8 + -1, bVar3) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    std::operator+(&local_148,'\"',pbVar9);
    std::operator+(&local_168,&local_148,'\"');
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_148);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_128 = local_128 + 1;
  std::__cxx11::to_string(&local_120,local_128);
  std::operator+(&local_148,"    static constexpr std::array<size_t, ",&local_120);
  std::operator+(&local_168,&local_148,"> val_start {\n        ");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_120);
  piVar6 = (local_100->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (local_100->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar10 = 0;
  lVar5 = 0;
  while( true ) {
    if (piVar6 == piVar2) break;
    if ((lVar5 != 0) && (lVar5 + (uVar10 / 10) * 10 == 0)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((long)*piVar6 == -1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::to_string
                (&local_148,
                 start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[*piVar6]);
      std::operator+(&local_168,&local_148,",");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_148);
    }
    piVar6 = piVar6 + 1;
    uVar10 = uVar10 + 1;
    lVar5 = lVar5 + -1;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::to_string(&local_120,local_128);
  std::operator+(&local_148,"    static constexpr std::array<size_t, ",&local_120);
  std::operator+(&local_168,&local_148,"> val_size {\n        ");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_120);
  piVar6 = (local_100->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (local_100->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar10 = 0;
  lVar5 = 0;
  while( true ) {
    if (piVar6 == piVar2) break;
    if ((lVar5 != 0) && (lVar5 + (uVar10 / 10) * 10 == 0)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((long)*piVar6 == -1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::to_string
                (&local_148,
                 sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[*piVar6]);
      std::operator+(&local_168,&local_148,",");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_148);
    }
    piVar6 = piVar6 + 1;
    uVar10 = uVar10 + 1;
    lVar5 = lVar5 + -1;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&sze.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::__cxx11::string::~string((string *)&upper_name);
  return __return_storage_ptr__;
}

Assistant:

std::string getCommonCodeGen(const std::vector<KeyType>& keys,
                             const std::vector<std::string> vals,
                             const std::vector<int>& mapping,
                             size_t n,
                             std::string map_name,
                             bool nonKeyLookups){
    std::string upper_name = map_name;
    std::transform(upper_name.begin(), upper_name.end(), upper_name.begin(), toupper);

    std::string str = "//CODEGEN FILE\n"
                      "#ifndef POIFECT_" + upper_name + "_H\n"
                      "#define POIFECT_" + upper_name + "_H\n"
                      "#include <array>\n";

    if(!nonKeyLookups) str += "#include <cassert>\n";

    str += "#include <limits>\n"
           "#include <string>\n\n";

    str += "class " + map_name + " final{\n"
    "public:\n"
    "    static " + (typeStr(keys[0])!="std::string" ? "constexpr " : "")
            + "std::string_view lookup(const " + typeStr(keys[0]) + "& key) noexcept;\n"
    "\n"
    "private:\n";

    if(!nonKeyLookups) str += "    #ifndef NDEBUG\n";
    writeKeys(str, keys, mapping, n);
    if(!nonKeyLookups) str += "    #endif\n";
    str += "\n";

    size_t num_chars = 0;
    std::vector<size_t> sze;
    std::vector<size_t> start;

    for(const std::string& val : vals){
        start.push_back(num_chars);
        num_chars += val.size();
        sze.push_back(val.size());
    }

    str += "    static constexpr char flat_vals[" + std::to_string(num_chars+1) + "] = ";
    for(const std::string& val : vals){
        str.push_back('\n');
        for(uint8_t i = 0; i < 8; i++) str.push_back(' ');
        str += '"' + val + '"';
    }
    str += ";\n\n";

    str += "    static constexpr std::array<size_t, " + std::to_string(n+1) + "> val_start {\n        ";
    size_t i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row == 0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else str += std::to_string(start[val]) + ",";
    }
    str += "\n    };\n\n";

    str += "    static constexpr std::array<size_t, " + std::to_string(n+1) + "> val_size {\n        ";
    i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row == 0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else str += std::to_string(sze[val]) + ",";
    }
    str += "\n    };\n\n";

    return str;
}